

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRReader.cpp
# Opt level: O1

Barcodes * __thiscall
ZXing::QRCode::Reader::decode
          (Barcodes *__return_storage_ptr__,Reader *this,BinaryBitmap *image,int maxSymbols)

{
  FinderPatternSet *fp_00;
  ConcentricPattern *__args;
  uint uVar1;
  double dVar2;
  void *pvVar3;
  undefined4 uVar4;
  pointer pCVar5;
  BitMatrix *image_00;
  __normal_iterator<const_ZXing::ConcentricPattern_*,_std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>_>
  _Var6;
  int iVar7;
  ConcentricPattern *fp;
  ConcentricPattern *pCVar8;
  pointer pFVar9;
  bool bVar10;
  vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_> usedFPs;
  FinderPatternSets allFPSets;
  FinderPatterns allFPs;
  DetectorResult detectorResult;
  DecoderResult decoderResult;
  void *local_198;
  iterator iStack_190;
  ConcentricPattern *local_188;
  BarcodeFormat local_17c;
  FinderPatternSets local_178;
  vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_> local_160;
  DetectorResult local_148;
  Reader *local_108;
  DecoderResult local_100;
  
  image_00 = BinaryBitmap::getBitMatrix(image);
  if (image_00 == (BitMatrix *)0x0) {
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    FindFinderPatterns(&local_160,image_00,
                       (bool)((byte)*(undefined4 *)(this->super_Reader)._opts & 1));
    local_188 = (ConcentricPattern *)0x0;
    local_198 = (void *)0x0;
    iStack_190._M_current = (ConcentricPattern *)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar1 = (((this->super_Reader)._opts)->_formats).i;
    if (uVar1 == 0 || (uVar1 >> 0xd & 1) != 0) {
      local_108 = this;
      GenerateFinderPatternSets(&local_178,&local_160);
      if ((pointer)CONCAT44(local_178.
                            super__Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_178.
                            super__Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_) !=
          local_178.
          super__Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pCVar8 = &((pointer)
                  CONCAT44(local_178.
                           super__Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           local_178.
                           super__Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_4_))->tl;
        do {
          fp_00 = (FinderPatternSet *)(pCVar8 + -1);
          _Var6 = std::
                  __find_if<__gnu_cxx::__normal_iterator<ZXing::ConcentricPattern_const*,std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>>,__gnu_cxx::__ops::_Iter_equals_val<ZXing::ConcentricPattern_const>>
                            (local_198,iStack_190._M_current,fp_00);
          iVar7 = 3;
          if ((_Var6._M_current == iStack_190._M_current) &&
             (_Var6 = std::
                      __find_if<__gnu_cxx::__normal_iterator<ZXing::ConcentricPattern_const*,std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>>,__gnu_cxx::__ops::_Iter_equals_val<ZXing::ConcentricPattern_const>>
                                (local_198,iStack_190._M_current,pCVar8),
             _Var6._M_current == iStack_190._M_current)) {
            __args = pCVar8 + 1;
            _Var6 = std::
                    __find_if<__gnu_cxx::__normal_iterator<ZXing::ConcentricPattern_const*,std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>>,__gnu_cxx::__ops::_Iter_equals_val<ZXing::ConcentricPattern_const>>
                              (local_198,iStack_190._M_current,__args);
            if (_Var6._M_current == iStack_190._M_current) {
              SampleQR(&local_148,image_00,fp_00);
              if (local_148._bits._bits.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  local_148._bits._bits.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
LAB_0018c396:
                iVar7 = 0;
              }
              else {
                Decode(&local_100,&local_148._bits);
                if ((local_100._content.bytes.
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start !=
                     local_100._content.bytes.
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish) && (local_100._error._type == None)) {
                  if (iStack_190._M_current == local_188) {
                    std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>::
                    _M_realloc_insert<ZXing::ConcentricPattern_const&>
                              ((vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>
                                *)&local_198,iStack_190,(ConcentricPattern *)fp_00);
                  }
                  else {
                    uVar4 = *(undefined4 *)&pCVar8[-1].field_0x14;
                    (iStack_190._M_current)->size = pCVar8[-1].size;
                    *(undefined4 *)&(iStack_190._M_current)->field_0x14 = uVar4;
                    dVar2 = pCVar8[-1].super_PointF.y;
                    ((iStack_190._M_current)->super_PointF).x = (fp_00->bl).super_PointF.x;
                    ((iStack_190._M_current)->super_PointF).y = dVar2;
                    iStack_190._M_current = iStack_190._M_current + 1;
                  }
                  if (iStack_190._M_current == local_188) {
                    std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>::
                    _M_realloc_insert<ZXing::ConcentricPattern_const&>
                              ((vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>
                                *)&local_198,iStack_190,pCVar8);
                  }
                  else {
                    uVar4 = *(undefined4 *)&pCVar8->field_0x14;
                    (iStack_190._M_current)->size = pCVar8->size;
                    *(undefined4 *)&(iStack_190._M_current)->field_0x14 = uVar4;
                    dVar2 = (pCVar8->super_PointF).y;
                    ((iStack_190._M_current)->super_PointF).x = (pCVar8->super_PointF).x;
                    ((iStack_190._M_current)->super_PointF).y = dVar2;
                    iStack_190._M_current = iStack_190._M_current + 1;
                  }
                  if (iStack_190._M_current == local_188) {
                    std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>::
                    _M_realloc_insert<ZXing::ConcentricPattern_const&>
                              ((vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>
                                *)&local_198,iStack_190,__args);
                  }
                  else {
                    uVar4 = *(undefined4 *)&pCVar8[1].field_0x14;
                    (iStack_190._M_current)->size = pCVar8[1].size;
                    *(undefined4 *)&(iStack_190._M_current)->field_0x14 = uVar4;
                    dVar2 = pCVar8[1].super_PointF.y;
                    ((iStack_190._M_current)->super_PointF).x = (__args->super_PointF).x;
                    ((iStack_190._M_current)->super_PointF).y = dVar2;
                    iStack_190._M_current = iStack_190._M_current + 1;
                  }
                }
                uVar1 = *(uint *)(local_108->super_Reader)._opts;
                if (local_100._content.bytes.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start ==
                    local_100._content.bytes.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  if ((uVar1 >> 9 & 1) != 0) goto LAB_0018c272;
LAB_0018c2d1:
                  iVar7 = 0;
                  bVar10 = true;
                }
                else {
                  bVar10 = local_100._error._type == None;
                  if ((uVar1 >> 9 & 1) != 0 && !bVar10) {
LAB_0018c272:
                    bVar10 = local_100._error._type != None;
                  }
                  if (!bVar10) goto LAB_0018c2d1;
                  local_17c = QRCode;
                  std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
                  emplace_back<ZXing::DecoderResult,ZXing::DetectorResult,ZXing::BarcodeFormat>
                            ((vector<ZXing::Result,std::allocator<ZXing::Result>> *)
                             __return_storage_ptr__,&local_100,&local_148,&local_17c);
                  if ((maxSymbols == 0) ||
                     ((int)((ulong)((long)(__return_storage_ptr__->
                                          super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(__return_storage_ptr__->
                                         super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      0x684bda13 != maxSymbols)) goto LAB_0018c2d1;
                  iVar7 = 2;
                  bVar10 = false;
                }
                if (local_100._extra.
                    super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_100._extra.
                             super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._error._msg._M_dataplus._M_p != &local_100._error._msg.field_2) {
                  operator_delete(local_100._error._msg._M_dataplus._M_p,
                                  local_100._error._msg.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._structuredAppend.id._M_dataplus._M_p !=
                    &local_100._structuredAppend.id.field_2) {
                  operator_delete(local_100._structuredAppend.id._M_dataplus._M_p,
                                  local_100._structuredAppend.id.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._ecLevel._M_dataplus._M_p != &local_100._ecLevel.field_2) {
                  operator_delete(local_100._ecLevel._M_dataplus._M_p,
                                  local_100._ecLevel.field_2._M_allocated_capacity + 1);
                }
                if (local_100._content.encodings.
                    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_100._content.encodings.
                                  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_100._content.encodings.
                                        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_100._content.encodings.
                                        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (local_100._content.bytes.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_100._content.bytes.
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_100._content.bytes.
                                        super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_100._content.bytes.
                                        super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (bVar10) goto LAB_0018c396;
              }
              if (local_148._bits._bits.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_148._bits._bits.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_148._bits._bits.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_148._bits._bits.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
          }
        } while (((iVar7 == 3) || (iVar7 == 0)) &&
                (pFVar9 = (pointer)(pCVar8 + 2), pCVar8 = pCVar8 + 3,
                pFVar9 != local_178.
                          super__Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
                          ._M_impl.super__Vector_impl_data._M_finish));
      }
      this = local_108;
      pvVar3 = (void *)CONCAT44(local_178.
                                super__Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_178.
                                super__Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)local_178.
                                     super__Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar3);
      }
    }
    pCVar5 = local_160.
             super__Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar1 = (((this->super_Reader)._opts)->_formats).i;
    if ((uVar1 == 0 || (uVar1 >> 0x10 & 1) != 0) &&
       ((pCVar8 = local_160.
                  super__Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                  ._M_impl.super__Vector_impl_data._M_start, maxSymbols == 0 ||
        ((int)((ulong)((long)(__return_storage_ptr__->
                             super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(__return_storage_ptr__->
                            super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
                            _M_impl.super__Vector_impl_data._M_start) >> 3) * 0x684bda13 !=
         maxSymbols)))) {
      for (; pCVar8 != pCVar5; pCVar8 = pCVar8 + 1) {
        _Var6 = std::
                __find_if<__gnu_cxx::__normal_iterator<ZXing::ConcentricPattern_const*,std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>>,__gnu_cxx::__ops::_Iter_equals_val<ZXing::ConcentricPattern_const>>
                          (local_198,iStack_190._M_current,pCVar8);
        iVar7 = 5;
        if (_Var6._M_current == iStack_190._M_current) {
          SampleMQR(&local_148,image_00,pCVar8);
          if (local_148._bits._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_148._bits._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish) {
LAB_0018c5f6:
            iVar7 = 0;
          }
          else {
            Decode(&local_100,&local_148._bits);
            uVar1 = *(uint *)(this->super_Reader)._opts;
            if (local_100._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_100._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              if ((uVar1 >> 9 & 1) != 0) goto LAB_0018c4cf;
LAB_0018c52c:
              iVar7 = 0;
              bVar10 = true;
            }
            else {
              bVar10 = local_100._error._type == None;
              if ((uVar1 >> 9 & 1) != 0 && !bVar10) {
LAB_0018c4cf:
                bVar10 = local_100._error._type != None;
              }
              if (!bVar10) goto LAB_0018c52c;
              local_178.
              super__Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x10000;
              std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
              emplace_back<ZXing::DecoderResult,ZXing::DetectorResult,ZXing::BarcodeFormat>
                        ((vector<ZXing::Result,std::allocator<ZXing::Result>> *)
                         __return_storage_ptr__,&local_100,&local_148,(BarcodeFormat *)&local_178);
              if ((maxSymbols == 0) ||
                 ((int)((ulong)((long)(__return_storage_ptr__->
                                      super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(__return_storage_ptr__->
                                     super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x684bda13
                  != maxSymbols)) goto LAB_0018c52c;
              iVar7 = 4;
              bVar10 = false;
            }
            if (local_100._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_100._extra.
                         super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._error._msg._M_dataplus._M_p != &local_100._error._msg.field_2) {
              operator_delete(local_100._error._msg._M_dataplus._M_p,
                              local_100._error._msg.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._structuredAppend.id._M_dataplus._M_p !=
                &local_100._structuredAppend.id.field_2) {
              operator_delete(local_100._structuredAppend.id._M_dataplus._M_p,
                              local_100._structuredAppend.id.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._ecLevel._M_dataplus._M_p != &local_100._ecLevel.field_2) {
              operator_delete(local_100._ecLevel._M_dataplus._M_p,
                              local_100._ecLevel.field_2._M_allocated_capacity + 1);
            }
            if (local_100._content.encodings.
                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_100._content.encodings.
                              super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_100._content.encodings.
                                    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_100._content.encodings.
                                    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_100._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_100._content.bytes.
                              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_100._content.bytes.
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_100._content.bytes.
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (bVar10) goto LAB_0018c5f6;
          }
          if (local_148._bits._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_148._bits._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_148._bits._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_148._bits._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        if ((iVar7 != 5) && (iVar7 != 0)) break;
      }
    }
    uVar1 = (((this->super_Reader)._opts)->_formats).i;
    if ((uVar1 == 0 || (uVar1 >> 0x11 & 1) != 0) &&
       ((pCVar8 = local_160.
                  super__Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                  ._M_impl.super__Vector_impl_data._M_start, maxSymbols == 0 ||
        ((int)((ulong)((long)(__return_storage_ptr__->
                             super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(__return_storage_ptr__->
                            super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
                            _M_impl.super__Vector_impl_data._M_start) >> 3) * 0x684bda13 !=
         maxSymbols)))) {
      for (; pCVar8 != local_160.
                       super__Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                       ._M_impl.super__Vector_impl_data._M_finish; pCVar8 = pCVar8 + 1) {
        _Var6 = std::
                __find_if<__gnu_cxx::__normal_iterator<ZXing::ConcentricPattern_const*,std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>>,__gnu_cxx::__ops::_Iter_equals_val<ZXing::ConcentricPattern_const>>
                          (local_198,iStack_190._M_current,pCVar8);
        iVar7 = 7;
        if (_Var6._M_current == iStack_190._M_current) {
          SampleRMQR(&local_148,image_00,pCVar8);
          if (local_148._bits._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_148._bits._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish) {
LAB_0018c82c:
            iVar7 = 0;
          }
          else {
            Decode(&local_100,&local_148._bits);
            uVar1 = *(uint *)(this->super_Reader)._opts;
            if (local_100._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_100._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              if ((uVar1 >> 9 & 1) != 0) goto LAB_0018c705;
LAB_0018c762:
              iVar7 = 0;
              bVar10 = true;
            }
            else {
              bVar10 = local_100._error._type == None;
              if ((uVar1 >> 9 & 1) != 0 && !bVar10) {
LAB_0018c705:
                bVar10 = local_100._error._type != None;
              }
              if (!bVar10) goto LAB_0018c762;
              local_178.
              super__Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x20000;
              std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
              emplace_back<ZXing::DecoderResult,ZXing::DetectorResult,ZXing::BarcodeFormat>
                        ((vector<ZXing::Result,std::allocator<ZXing::Result>> *)
                         __return_storage_ptr__,&local_100,&local_148,(BarcodeFormat *)&local_178);
              if ((maxSymbols == 0) ||
                 ((int)((ulong)((long)(__return_storage_ptr__->
                                      super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(__return_storage_ptr__->
                                     super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x684bda13
                  != maxSymbols)) goto LAB_0018c762;
              iVar7 = 6;
              bVar10 = false;
            }
            if (local_100._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_100._extra.
                         super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._error._msg._M_dataplus._M_p != &local_100._error._msg.field_2) {
              operator_delete(local_100._error._msg._M_dataplus._M_p,
                              local_100._error._msg.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._structuredAppend.id._M_dataplus._M_p !=
                &local_100._structuredAppend.id.field_2) {
              operator_delete(local_100._structuredAppend.id._M_dataplus._M_p,
                              local_100._structuredAppend.id.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._ecLevel._M_dataplus._M_p != &local_100._ecLevel.field_2) {
              operator_delete(local_100._ecLevel._M_dataplus._M_p,
                              local_100._ecLevel.field_2._M_allocated_capacity + 1);
            }
            if (local_100._content.encodings.
                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_100._content.encodings.
                              super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_100._content.encodings.
                                    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_100._content.encodings.
                                    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_100._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_100._content.bytes.
                              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_100._content.bytes.
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_100._content.bytes.
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (bVar10) goto LAB_0018c82c;
          }
          if (local_148._bits._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_148._bits._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_148._bits._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_148._bits._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        if ((iVar7 != 7) && (iVar7 != 0)) break;
      }
    }
    if (local_198 != (void *)0x0) {
      operator_delete(local_198,(long)local_188 - (long)local_198);
    }
    if (local_160.
        super__Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>.
        _M_impl.super__Vector_impl_data._M_start != (ConcentricPattern *)0x0) {
      operator_delete(local_160.
                      super__Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_160.
                            super__Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_160.
                            super__Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Barcodes Reader::decode(const BinaryBitmap& image, int maxSymbols) const
{
	auto binImg = image.getBitMatrix();
	if (binImg == nullptr)
		return {};

#ifdef PRINT_DEBUG
	LogMatrixWriter lmw(log, *binImg, 5, "qr-log.pnm");
#endif
	
	auto allFPs = FindFinderPatterns(*binImg, _opts.tryHarder());

#ifdef PRINT_DEBUG
	printf("allFPs: %d\n", Size(allFPs));
#endif

	std::vector<ConcentricPattern> usedFPs;
	Barcodes res;
	
	if (_opts.hasFormat(BarcodeFormat::QRCode)) {
		auto allFPSets = GenerateFinderPatternSets(allFPs);
		for (const auto& fpSet : allFPSets) {
			if (Contains(usedFPs, fpSet.bl) || Contains(usedFPs, fpSet.tl) || Contains(usedFPs, fpSet.tr))
				continue;

			logFPSet(fpSet);

			auto detectorResult = SampleQR(*binImg, fpSet);
			if (detectorResult.isValid()) {
				auto decoderResult = Decode(detectorResult.bits());
				if (decoderResult.isValid()) {
					usedFPs.push_back(fpSet.bl);
					usedFPs.push_back(fpSet.tl);
					usedFPs.push_back(fpSet.tr);
				}
				if (decoderResult.isValid(_opts.returnErrors())) {
					res.emplace_back(std::move(decoderResult), std::move(detectorResult), BarcodeFormat::QRCode);
					if (maxSymbols && Size(res) == maxSymbols)
						break;
				}
			}
		}
	}
	
	if (_opts.hasFormat(BarcodeFormat::MicroQRCode) && !(maxSymbols && Size(res) == maxSymbols)) {
		for (const auto& fp : allFPs) {
			if (Contains(usedFPs, fp))
				continue;

			auto detectorResult = SampleMQR(*binImg, fp);
			if (detectorResult.isValid()) {
				auto decoderResult = Decode(detectorResult.bits());
				if (decoderResult.isValid(_opts.returnErrors())) {
					res.emplace_back(std::move(decoderResult), std::move(detectorResult), BarcodeFormat::MicroQRCode);
					if (maxSymbols && Size(res) == maxSymbols)
						break;
				}

			}
		}
	}
	
	if (_opts.hasFormat(BarcodeFormat::RMQRCode) && !(maxSymbols && Size(res) == maxSymbols)) {
		// TODO proper
		for (const auto& fp : allFPs) {
			if (Contains(usedFPs, fp))
				continue;

			auto detectorResult = SampleRMQR(*binImg, fp);
			if (detectorResult.isValid()) {
				auto decoderResult = Decode(detectorResult.bits());
				if (decoderResult.isValid(_opts.returnErrors())) {
					res.emplace_back(std::move(decoderResult), std::move(detectorResult), BarcodeFormat::RMQRCode);
					if (maxSymbols && Size(res) == maxSymbols)
						break;
				}

			}
		}
	}

	return res;
}